

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFFLoader.cpp
# Opt level: O0

void __thiscall
Assimp::NFFImporter::LoadNFF2MaterialTable
          (NFFImporter *this,
          vector<Assimp::NFFImporter::ShadingInfo,_std::allocator<Assimp::NFFImporter::ShadingInfo>_>
          *output,string *path,IOSystem *pIOHandler)

{
  char *pcVar1;
  bool bVar2;
  uint uVar3;
  IOStream *__p;
  pointer pIVar4;
  Logger *pLVar5;
  reference szBuffer;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar6;
  basic_formatter *pbVar7;
  aiColor3D *o;
  ai_real *paVar8;
  undefined1 local_167c [8];
  aiColor3D c;
  string local_14f8;
  ShadingInfo local_14d8;
  allocator<char> local_1439;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1438;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1418;
  string local_12a0;
  char *local_1280;
  char *sz;
  char line [4096];
  ShadingInfo *curShader;
  string local_f8;
  reference local_d8;
  char *buffer;
  undefined1 local_c8 [8];
  vector<char,_std::allocator<char>_> mBuffer2;
  uint m;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  allocator<char> local_51;
  string local_50;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> local_30;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> file;
  IOSystem *pIOHandler_local;
  string *path_local;
  vector<Assimp::NFFImporter::ShadingInfo,_std::allocator<Assimp::NFFImporter::ShadingInfo>_>
  *output_local;
  NFFImporter *this_local;
  
  file._M_t.super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>._M_t.
  super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
  super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl =
       (__uniq_ptr_data<Assimp::IOStream,_std::default_delete<Assimp::IOStream>,_true,_true>)
       (__uniq_ptr_data<Assimp::IOStream,_std::default_delete<Assimp::IOStream>,_true,_true>)
       pIOHandler;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"rb",&local_51);
  __p = IOSystem::Open(pIOHandler,path,&local_50);
  std::unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>>::
  unique_ptr<std::default_delete<Assimp::IOStream>,void>
            ((unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>> *)&local_30,__p);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  pIVar4 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get(&local_30)
  ;
  if (pIVar4 == (pointer)0x0) {
    pLVar5 = DefaultLogger::get();
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&m,
                   "NFF2: Unable to open material library ",path);
    std::operator+(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&m
                   ,".");
    Logger::error(pLVar5,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&m);
    mBuffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 1;
  }
  else {
    pIVar4 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::operator->
                       (&local_30);
    mBuffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ =
         (*pIVar4->_vptr_IOStream[6])();
    uVar3 = mBuffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ + 1;
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_c8,(ulong)uVar3,
               (allocator_type *)((long)&buffer + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&buffer + 7));
    pIVar4 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get
                       (&local_30);
    BaseImporter::TextFileToBuffer
              (pIVar4,(vector<char,_std::allocator<char>_> *)local_c8,FORBID_EMPTY);
    local_d8 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)local_c8,0);
    szBuffer = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)local_c8,0);
    CommentRemover::RemoveLineComments("//",szBuffer,' ');
    bVar2 = TokenMatch<char_const>(&local_d8,"mat",3);
    if (bVar2) {
      line[0xff8] = '\0';
      line[0xff9] = '\0';
      line[0xffa] = '\0';
      line[0xffb] = '\0';
      line[0xffc] = '\0';
      line[0xffd] = '\0';
      line[0xffe] = '\0';
      line[0xfff] = '\0';
      while (bVar2 = GetNextLine<char>(&local_d8,(char *)&sz), bVar2) {
        SkipSpaces<char>((char *)&sz,&local_1280);
        bVar2 = TokenMatch<char_const>(&local_1280,"version",7);
        if (bVar2) {
          pLVar5 = DefaultLogger::get();
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[44]>
                    (&local_1418,(char (*) [44])"NFF (Sense8) material library file format: ");
          pcVar1 = local_1280;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1438,pcVar1,&local_1439);
          pbVar7 = (basic_formatter *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                             &local_1418,&local_1438);
          Formatter::basic_formatter::operator_cast_to_string(&local_12a0,pbVar7);
          Logger::info(pLVar5,&local_12a0);
          std::__cxx11::string::~string((string *)&local_12a0);
          std::__cxx11::string::~string((string *)&local_1438);
          std::allocator<char>::~allocator(&local_1439);
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          ~basic_formatter(&local_1418);
        }
        else {
          bVar2 = TokenMatch<char_const>(&local_1280,"matdef",6);
          if (bVar2) {
            ShadingInfo::ShadingInfo(&local_14d8);
            std::
            vector<Assimp::NFFImporter::ShadingInfo,_std::allocator<Assimp::NFFImporter::ShadingInfo>_>
            ::push_back(output,&local_14d8);
            ShadingInfo::~ShadingInfo(&local_14d8);
            line._4088_8_ =
                 std::
                 vector<Assimp::NFFImporter::ShadingInfo,_std::allocator<Assimp::NFFImporter::ShadingInfo>_>
                 ::back(output);
          }
          else {
            bVar2 = TokenMatch<char_const>(&local_1280,"valid",5);
            if ((!bVar2) && (bVar2 = IsLineEnd<char>(*local_1280), !bVar2)) {
              if (line._4088_8_ == 0) {
                pLVar5 = DefaultLogger::get();
                Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
                basic_formatter<char[38]>
                          ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &c.g,(char (*) [38])"NFF2 material library: Found element ");
                pbVar6 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                         Formatter::
                         basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                         operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                                    *)&c.g,&local_1280);
                pbVar7 = (basic_formatter *)
                         Formatter::
                         basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                         operator_(pbVar6,(char (*) [32])"but there is no active material");
                Formatter::basic_formatter::operator_cast_to_string(&local_14f8,pbVar7);
                Logger::error(pLVar5,&local_14f8);
                std::__cxx11::string::~string((string *)&local_14f8);
                Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
                ~basic_formatter((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&c.g);
              }
              else {
                aiColor3D::aiColor3D((aiColor3D *)local_167c);
                bVar2 = TokenMatch<char_const>(&local_1280,"ambient",7);
                if (bVar2) {
                  SkipSpaces<char>(&local_1280);
                  bVar2 = IsLineEnd<char>(*local_1280);
                  pcVar1 = local_1280;
                  if (!bVar2) {
                    paVar8 = aiColor3D::operator[]((aiColor3D *)local_167c,0);
                    local_1280 = fast_atoreal_move<float>(pcVar1,paVar8,true);
                  }
                  SkipSpaces<char>(&local_1280);
                  bVar2 = IsLineEnd<char>(*local_1280);
                  pcVar1 = local_1280;
                  if (!bVar2) {
                    paVar8 = aiColor3D::operator[]((aiColor3D *)local_167c,1);
                    local_1280 = fast_atoreal_move<float>(pcVar1,paVar8,true);
                  }
                  SkipSpaces<char>(&local_1280);
                  bVar2 = IsLineEnd<char>(*local_1280);
                  pcVar1 = local_1280;
                  if (!bVar2) {
                    paVar8 = aiColor3D::operator[]((aiColor3D *)local_167c,2);
                    local_1280 = fast_atoreal_move<float>(pcVar1,paVar8,true);
                  }
                  aiColor3D::operator=((aiColor3D *)(line._4088_8_ + 0x24),(aiColor3D *)local_167c);
                }
                else {
                  bVar2 = TokenMatch<char_const>(&local_1280,"diffuse",7);
                  if ((bVar2) ||
                     (bVar2 = TokenMatch<char_const>(&local_1280,"ambientdiffuse",0xe), bVar2)) {
                    SkipSpaces<char>(&local_1280);
                    bVar2 = IsLineEnd<char>(*local_1280);
                    pcVar1 = local_1280;
                    if (!bVar2) {
                      paVar8 = aiColor3D::operator[]((aiColor3D *)local_167c,0);
                      local_1280 = fast_atoreal_move<float>(pcVar1,paVar8,true);
                    }
                    SkipSpaces<char>(&local_1280);
                    bVar2 = IsLineEnd<char>(*local_1280);
                    pcVar1 = local_1280;
                    if (!bVar2) {
                      paVar8 = aiColor3D::operator[]((aiColor3D *)local_167c,1);
                      local_1280 = fast_atoreal_move<float>(pcVar1,paVar8,true);
                    }
                    SkipSpaces<char>(&local_1280);
                    bVar2 = IsLineEnd<char>(*local_1280);
                    pcVar1 = local_1280;
                    if (!bVar2) {
                      paVar8 = aiColor3D::operator[]((aiColor3D *)local_167c,2);
                      local_1280 = fast_atoreal_move<float>(pcVar1,paVar8,true);
                    }
                    o = aiColor3D::operator=
                                  ((aiColor3D *)(line._4088_8_ + 0x24),(aiColor3D *)local_167c);
                    aiColor3D::operator=((aiColor3D *)(line._4088_8_ + 0xc),o);
                  }
                  else {
                    bVar2 = TokenMatch<char_const>(&local_1280,"specular",8);
                    if (bVar2) {
                      SkipSpaces<char>(&local_1280);
                      bVar2 = IsLineEnd<char>(*local_1280);
                      pcVar1 = local_1280;
                      if (!bVar2) {
                        paVar8 = aiColor3D::operator[]((aiColor3D *)local_167c,0);
                        local_1280 = fast_atoreal_move<float>(pcVar1,paVar8,true);
                      }
                      SkipSpaces<char>(&local_1280);
                      bVar2 = IsLineEnd<char>(*local_1280);
                      pcVar1 = local_1280;
                      if (!bVar2) {
                        paVar8 = aiColor3D::operator[]((aiColor3D *)local_167c,1);
                        local_1280 = fast_atoreal_move<float>(pcVar1,paVar8,true);
                      }
                      SkipSpaces<char>(&local_1280);
                      bVar2 = IsLineEnd<char>(*local_1280);
                      pcVar1 = local_1280;
                      if (!bVar2) {
                        paVar8 = aiColor3D::operator[]((aiColor3D *)local_167c,2);
                        local_1280 = fast_atoreal_move<float>(pcVar1,paVar8,true);
                      }
                      aiColor3D::operator=
                                ((aiColor3D *)(line._4088_8_ + 0x18),(aiColor3D *)local_167c);
                    }
                    else {
                      bVar2 = TokenMatch<char_const>(&local_1280,"emission",8);
                      if (bVar2) {
                        SkipSpaces<char>(&local_1280);
                        bVar2 = IsLineEnd<char>(*local_1280);
                        pcVar1 = local_1280;
                        if (!bVar2) {
                          paVar8 = aiColor3D::operator[]((aiColor3D *)local_167c,0);
                          local_1280 = fast_atoreal_move<float>(pcVar1,paVar8,true);
                        }
                        SkipSpaces<char>(&local_1280);
                        bVar2 = IsLineEnd<char>(*local_1280);
                        pcVar1 = local_1280;
                        if (!bVar2) {
                          paVar8 = aiColor3D::operator[]((aiColor3D *)local_167c,1);
                          local_1280 = fast_atoreal_move<float>(pcVar1,paVar8,true);
                        }
                        SkipSpaces<char>(&local_1280);
                        bVar2 = IsLineEnd<char>(*local_1280);
                        pcVar1 = local_1280;
                        if (!bVar2) {
                          paVar8 = aiColor3D::operator[]((aiColor3D *)local_167c,2);
                          local_1280 = fast_atoreal_move<float>(pcVar1,paVar8,true);
                        }
                        aiColor3D::operator=
                                  ((aiColor3D *)(line._4088_8_ + 0x30),(aiColor3D *)local_167c);
                      }
                      else {
                        bVar2 = TokenMatch<char_const>(&local_1280,"shininess",9);
                        if (bVar2) {
                          SkipSpaces<char>(&local_1280);
                          bVar2 = IsLineEnd<char>(*local_1280);
                          if (!bVar2) {
                            local_1280 = fast_atoreal_move<float>
                                                   (local_1280,(float *)(line._4088_8_ + 0x68),true)
                            ;
                          }
                        }
                        else {
                          bVar2 = TokenMatch<char_const>(&local_1280,"opacity",7);
                          if (bVar2) {
                            SkipSpaces<char>(&local_1280);
                            bVar2 = IsLineEnd<char>(*local_1280);
                            if (!bVar2) {
                              local_1280 = fast_atoreal_move<float>
                                                     (local_1280,(float *)(line._4088_8_ + 100),true
                                                     );
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      mBuffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 0;
    }
    else {
      pLVar5 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[36]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&curShader,
                 (char (*) [36])"NFF2: Not a valid material library ");
      pbVar6 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                         &curShader,path);
      pbVar7 = (basic_formatter *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_(pbVar6,(char (*) [2])0xbb58f9);
      Formatter::basic_formatter::operator_cast_to_string(&local_f8,pbVar7);
      Logger::error(pLVar5,&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &curShader);
      mBuffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 1;
    }
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)local_c8);
  }
  std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::~unique_ptr(&local_30);
  return;
}

Assistant:

void NFFImporter::LoadNFF2MaterialTable(std::vector<ShadingInfo>& output,
    const std::string& path, IOSystem* pIOHandler)
{
    std::unique_ptr<IOStream> file( pIOHandler->Open( path, "rb"));

    // Check whether we can read from the file
    if( !file.get())    {
        ASSIMP_LOG_ERROR("NFF2: Unable to open material library " + path + ".");
        return;
    }

    // get the size of the file
    const unsigned int m = (unsigned int)file->FileSize();

    // allocate storage and copy the contents of the file to a memory buffer
    // (terminate it with zero)
    std::vector<char> mBuffer2(m+1);
    TextFileToBuffer(file.get(),mBuffer2);
    const char* buffer = &mBuffer2[0];

    // First of all: remove all comments from the file
    CommentRemover::RemoveLineComments("//",&mBuffer2[0]);

    // The file should start with the magic sequence "mat"
    if (!TokenMatch(buffer,"mat",3))    {
        ASSIMP_LOG_ERROR_F("NFF2: Not a valid material library ", path, ".");
        return;
    }

    ShadingInfo* curShader = NULL;

    // No read the file line per line
    char line[4096];
    const char* sz;
    while (GetNextLine(buffer,line))
    {
        SkipSpaces(line,&sz);

        // 'version' defines the version of the file format
        if (TokenMatch(sz,"version",7))
        {
            ASSIMP_LOG_INFO_F("NFF (Sense8) material library file format: ", std::string(sz));
        }
        // 'matdef' starts a new material in the file
        else if (TokenMatch(sz,"matdef",6))
        {
            // add a new material to the list
            output.push_back( ShadingInfo() );
            curShader = & output.back();

            // parse the name of the material
        }
        else if (!TokenMatch(sz,"valid",5))
        {
            // check whether we have an active material at the moment
            if (!IsLineEnd(*sz))
            {
                if (!curShader)
                {
                    ASSIMP_LOG_ERROR_F("NFF2 material library: Found element ", sz, "but there is no active material");
                    continue;
                }
            }
            else continue;

            // now read the material property and determine its type
            aiColor3D c;
            if (TokenMatch(sz,"ambient",7))
            {
                AI_NFF_PARSE_TRIPLE(c);
                curShader->ambient = c;
            }
            else if (TokenMatch(sz,"diffuse",7) || TokenMatch(sz,"ambientdiffuse",14) /* correct? */)
            {
                AI_NFF_PARSE_TRIPLE(c);
                curShader->diffuse = curShader->ambient = c;
            }
            else if (TokenMatch(sz,"specular",8))
            {
                AI_NFF_PARSE_TRIPLE(c);
                curShader->specular = c;
            }
            else if (TokenMatch(sz,"emission",8))
            {
                AI_NFF_PARSE_TRIPLE(c);
                curShader->emissive = c;
            }
            else if (TokenMatch(sz,"shininess",9))
            {
                AI_NFF_PARSE_FLOAT(curShader->shininess);
            }
            else if (TokenMatch(sz,"opacity",7))
            {
                AI_NFF_PARSE_FLOAT(curShader->opacity);
            }
        }
    }
}